

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O2

UnicodeString * __thiscall icu_63::LocaleKey::currentID(LocaleKey *this,UnicodeString *result)

{
  if ((undefined1  [56])((undefined1  [56])(this->_currentID).fUnion & (undefined1  [56])0x1) ==
      (undefined1  [56])0x0) {
    UnicodeString::append(result,&this->_currentID);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleKey::currentID(UnicodeString& result) const {
    if (!_currentID.isBogus()) {
        result.append(_currentID);
    }
    return result;
}